

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

xml_output * valueTagDefX(QStringList *v,QString *tagName,char *s)

{
  bool bVar1;
  QListSpecialMethods<QString> *in_RCX;
  QList<QString> *in_RDX;
  xml_output *in_RDI;
  long in_FS_OFFSET;
  QStringList temp;
  QList<QString> *in_stack_ffffffffffffff38;
  QList<QString> *in_stack_ffffffffffffff40;
  xml_output *sep;
  QList<QString> *this;
  char *in_stack_ffffffffffffff78;
  QChar in_stack_ffffffffffffff8e;
  QChar local_52 [25];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sep = in_RDI;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x2486f7);
  if (bVar1) {
    noxml();
  }
  else {
    local_20 = 0xaaaaaaaaaaaaaaaa;
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::QList(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QString::QString((QString *)in_RDI,in_stack_ffffffffffffff78);
    this = in_RDX;
    QChar::QChar<char16_t,_true>(local_52,L' ');
    QString::arg<QString,_true>
              ((QString *)this,(QString *)in_RCX,(int)((ulong)sep >> 0x20),in_stack_ffffffffffffff8e
              );
    QList<QString>::append(in_RDX,(rvalue_ref)in_stack_ffffffffffffff38);
    QString::~QString((QString *)0x2487b6);
    QString::~QString((QString *)0x2487c0);
    QString::QString((QString *)in_RDI,in_stack_ffffffffffffff78);
    QListSpecialMethods<QString>::join(in_RCX,(QString *)sep);
    valueTag((QString *)in_RCX);
    QString::~QString((QString *)0x2487ff);
    QString::~QString((QString *)0x248809);
    QList<QString>::~QList((QList<QString> *)0x248816);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return sep;
  }
  __stack_chk_fail();
}

Assistant:

inline XmlOutput::xml_output valueTagDefX(const QStringList &v, const QString &tagName, const char *s = " ")
{
    if(v.isEmpty())
        return noxml();
    QStringList temp = v;
    temp.append(QString("%(%1)").arg(tagName));
    return valueTag(temp.join(s));
}